

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ManBreakTies(Iso_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  Iso_Obj_t *pIVar4;
  int i;
  
  puVar3 = (uint *)Vec_PtrEntry(p->vClasses,0);
  uVar1 = *puVar3;
  i = 0;
  if (fVerbose != 0) {
    printf("Best level %d\n",(ulong)(uVar1 & 0x3fffffff));
    i = 0;
  }
  while( true ) {
    if (p->vClasses->nSize <= i) {
      return;
    }
    pIVar4 = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,i);
    if ((*(uint *)pIVar4 & 0x3fffffff) < (uVar1 & 0x3fffffff)) break;
    for (; pIVar4 != (Iso_Obj_t *)0x0; pIVar4 = Iso_ManObj(p,pIVar4->iClass)) {
      if (pIVar4->Id != 0) {
        __assert_fail("pTemp->Id == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                      ,0x424,"void Iso_ManBreakTies(Iso_Man_t *, int)");
      }
      iVar2 = p->nObjIds;
      p->nObjIds = iVar2 + 1;
      pIVar4->Id = iVar2;
    }
    i = i + 1;
  }
  return;
}

Assistant:

void Iso_ManBreakTies( Iso_Man_t * p, int fVerbose )
{
    int fUseOneBest = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i, LevelStart = 0;
    pIso = (Iso_Obj_t *)Vec_PtrEntry( p->vClasses, 0 );
    LevelStart = pIso->Level;
    if ( fVerbose )
        printf( "Best level %d\n", LevelStart ); 
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( (int)pIso->Level < LevelStart )
            break;
        if ( !fUseOneBest )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            {
                assert( pTemp->Id ==  0 );
                pTemp->Id = p->nObjIds++;
            }
            continue;
        }
        if ( pIso->Level == 0 )//&& pIso->nFoutPos + pIso->nFoutNeg == 0 )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
                pTemp->Id = p->nObjIds++;
            continue;
        }
        pIso = Iso_ManFindBestObj( p, pIso );
        pIso->Id = p->nObjIds++;
    }
}